

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildTestDyndepBuild::Run(BuildTestDyndepBuild *this)

{
  Builder *this_00;
  int iVar1;
  size_t sVar2;
  Test *pTVar3;
  bool bVar4;
  Node *pNVar5;
  size_type sVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  string err;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  iVar1 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule touch\n  command = touch $out\nrule cp\n  command = cp $in $out\nbuild dd: cp dd-in\nbuild out: touch || dd\n  dyndep = dd\n"
              ,(ManifestParserOptions)0x0);
  if (iVar1 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"dd-in",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"ninja_dyndep_version = 1\nbuild out: dyndep\n",&local_71);
  VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar3 = g_current_test;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out",&local_72);
  this_00 = &(this->super_BuildTest).builder_;
  pNVar5 = Builder::AddTarget(this_00,&local_70,&local_50);
  testing::Test::Check
            (pTVar3,pNVar5 != (Node *)0x0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0xbde,"builder_.AddTarget(\"out\", &err)");
  std::__cxx11::string::~string((string *)&local_70);
  pTVar3 = g_current_test;
  bVar4 = std::operator==("",&local_50);
  testing::Test::Check
            (pTVar3,bVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0xbdf,"\"\" == err");
  pTVar3 = g_current_test;
  sVar2 = (this->super_BuildTest).fs_.files_created_._M_t._M_impl.super__Rb_tree_header.
          _M_node_count;
  bVar4 = Builder::Build(this_00,&local_50);
  testing::Test::Check
            (pTVar3,bVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0xbe2,"builder_.Build(&err)");
  pTVar3 = g_current_test;
  bVar4 = std::operator==("",&local_50);
  testing::Test::Check
            (pTVar3,bVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0xbe3,"\"\" == err");
  bVar4 = testing::Test::Check
                    (g_current_test,
                     (long)(this->super_BuildTest).command_runner_.commands_ran_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->super_BuildTest).command_runner_.commands_ran_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start == 0x40,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0xbe5,"2u == command_runner_.commands_ran_.size()");
  pTVar3 = g_current_test;
  if (bVar4) {
    bVar4 = std::operator==("cp dd-in dd",
                            (this->super_BuildTest).command_runner_.commands_ran_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xbe6,"\"cp dd-in dd\" == command_runner_.commands_ran_[0]");
    pTVar3 = g_current_test;
    bVar4 = std::operator==("touch out",
                            (this->super_BuildTest).command_runner_.commands_ran_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xbe7,"\"touch out\" == command_runner_.commands_ran_[1]");
    bVar4 = testing::Test::Check
                      (g_current_test,
                       (long)(this->super_BuildTest).fs_.files_read_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_BuildTest).fs_.files_read_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start == 0x40,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0xbe8,"2u == fs_.files_read_.size()");
    pTVar3 = g_current_test;
    if (bVar4) {
      bVar4 = std::operator==("dd-in",(this->super_BuildTest).fs_.files_read_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      testing::Test::Check
                (pTVar3,bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0xbe9,"\"dd-in\" == fs_.files_read_[0]");
      pTVar3 = g_current_test;
      bVar4 = std::operator==("dd",(this->super_BuildTest).fs_.files_read_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1);
      testing::Test::Check
                (pTVar3,bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0xbea,"\"dd\" == fs_.files_read_[1]");
      bVar4 = testing::Test::Check
                        (g_current_test,
                         sVar2 + 2 ==
                         (this->super_BuildTest).fs_.files_created_._M_t._M_impl.
                         super__Rb_tree_header._M_node_count,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0xbeb,"2u + files_created == fs_.files_created_.size()");
      pTVar3 = g_current_test;
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"dd",&local_72);
        this_01 = &(this->super_BuildTest).fs_.files_created_;
        sVar6 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(this_01,&local_70);
        testing::Test::Check
                  (pTVar3,sVar6 == 1,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0xbec,"1u == fs_.files_created_.count(\"dd\")");
        std::__cxx11::string::~string((string *)&local_70);
        pTVar3 = g_current_test;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out",&local_72);
        sVar6 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(this_01,&local_70);
        testing::Test::Check
                  (pTVar3,sVar6 == 1,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0xbed,"1u == fs_.files_created_.count(\"out\")");
        std::__cxx11::string::~string((string *)&local_70);
        goto LAB_001372cf;
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_001372cf:
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

TEST_F(BuildTest, DyndepBuild) {
  // Verify that a dyndep file can be built and loaded to discover nothing.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch\n"
"  command = touch $out\n"
"rule cp\n"
"  command = cp $in $out\n"
"build dd: cp dd-in\n"
"build out: touch || dd\n"
"  dyndep = dd\n"
));
  fs_.Create("dd-in",
"ninja_dyndep_version = 1\n"
"build out: dyndep\n"
);

  string err;
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  EXPECT_EQ("", err);

  size_t files_created = fs_.files_created_.size();
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);

  ASSERT_EQ(2u, command_runner_.commands_ran_.size());
  EXPECT_EQ("cp dd-in dd", command_runner_.commands_ran_[0]);
  EXPECT_EQ("touch out", command_runner_.commands_ran_[1]);
  ASSERT_EQ(2u, fs_.files_read_.size());
  EXPECT_EQ("dd-in", fs_.files_read_[0]);
  EXPECT_EQ("dd", fs_.files_read_[1]);
  ASSERT_EQ(2u + files_created, fs_.files_created_.size());
  EXPECT_EQ(1u, fs_.files_created_.count("dd"));
  EXPECT_EQ(1u, fs_.files_created_.count("out"));
}